

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler,bool isKey)

{
  byte *pbVar1;
  char *pcVar2;
  Stack<rapidjson::CrtAllocator> *pSVar3;
  SizeType SVar4;
  bool bVar5;
  uint codepoint;
  uint uVar6;
  byte *pbVar7;
  Ch *str;
  byte bVar8;
  StackStream<char> stackStream;
  GenericStringStream<rapidjson::UTF8<char>_> local_68;
  GenericStringStream<rapidjson::UTF8<char>_> *local_58;
  StackStream<char> local_48;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *local_38;
  
  local_68.src_ = is->src_;
  local_68.head_ = is->head_;
  local_48.length_ = 0;
  local_58 = is;
  local_48.stack_ = (Stack<rapidjson::CrtAllocator> *)this;
  local_38 = handler;
  if (*local_68.src_ != '\"') {
    __assert_fail("is.Peek() == \'\\\"\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                  ,0x2a7,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                 );
  }
  local_68.src_ = local_68.src_ + 1;
  while (pSVar3 = local_48.stack_, bVar8 = *local_68.src_, bVar8 == 0x5c) {
    pbVar1 = (byte *)(local_68.src_ + 2);
    bVar8 = ParseStringToStream<0u,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>(rapidjson::GenericStringStream<rapidjson::UTF8<char>>&,rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>&)
            ::escape[(byte)local_68.src_[1]];
    if (bVar8 == 0) {
      if (local_68.src_[1] != 0x75) {
        if (*(int *)(this + 0x30) != 0) {
          local_68.src_ = (Ch *)pbVar1;
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x2c2,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                       );
        }
        pbVar7 = (byte *)(local_68.src_ + ~(ulong)local_68.head_ + 2);
        *(undefined4 *)(this + 0x30) = 10;
        local_68.src_ = (Ch *)pbVar1;
LAB_0011b2dd:
        *(byte **)(this + 0x38) = pbVar7;
        goto LAB_0011b2e1;
      }
      local_68.src_ = (Ch *)pbVar1;
      codepoint = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,&local_68);
      if (*(int *)(this + 0x30) != 0) goto LAB_0011b2e1;
      if ((codepoint & 0xfffffc00) == 0xd800) {
        pbVar1 = (byte *)(local_68.src_ + 1);
        if ((*local_68.src_ != 0x5c) ||
           (pbVar1 = (byte *)(local_68.src_ + 2), local_68.src_[1] != 0x75)) {
          local_68.src_ = (Ch *)pbVar1;
          pbVar7 = (byte *)(local_68.src_ + (-2 - (long)local_68.head_));
          *(undefined4 *)(this + 0x30) = 9;
          goto LAB_0011b2dd;
        }
        local_68.src_ = local_68.src_ + 2;
        uVar6 = ParseHex4<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(this,&local_68);
        if (*(int *)(this + 0x30) == 0) {
          if (uVar6 - 0xe000 < 0xfffffc00) {
            *(undefined4 *)(this + 0x30) = 9;
            *(Ch **)(this + 0x38) = local_68.src_ + (-2 - (long)local_68.head_);
            goto LAB_0011b200;
          }
          codepoint = codepoint * 0x400 + uVar6 + 0xfca02400;
          bVar5 = true;
        }
        else {
LAB_0011b200:
          bVar5 = false;
        }
        if (!bVar5) goto LAB_0011b2e1;
      }
      UTF8<char>::
      Encode<rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::StackStream<char>>
                (&local_48,codepoint);
    }
    else {
      local_68.src_ = (Ch *)pbVar1;
      if ((local_48.stack_)->stackEnd_ <= (local_48.stack_)->stackTop_ + 1) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_48.stack_,1);
      }
LAB_0011b15f:
      pbVar1 = (byte *)pSVar3->stackTop_;
      pSVar3->stackTop_ = (char *)(pbVar1 + 1);
      *pbVar1 = bVar8;
      local_48.length_ = local_48.length_ + 1;
    }
  }
  if (bVar8 == 0) {
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x2ca,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0xb;
  }
  else {
    if (bVar8 == 0x22) {
      local_68.src_ = local_68.src_ + 1;
      if ((local_48.stack_)->stackEnd_ <= (local_48.stack_)->stackTop_ + 1) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_48.stack_,1);
      }
      pcVar2 = pSVar3->stackTop_;
      pSVar3->stackTop_ = pcVar2 + 1;
      *pcVar2 = '\0';
      local_48.length_ = local_48.length_ + 1;
      goto LAB_0011b2e1;
    }
    if (0x1f < bVar8) {
      pbVar1 = (byte *)(local_68.src_ + 1);
      bVar8 = *local_68.src_;
      local_68.src_ = (Ch *)pbVar1;
      if ((local_48.stack_)->stackEnd_ <= (local_48.stack_)->stackTop_ + 1) {
        internal::Stack<rapidjson::CrtAllocator>::Expand<char>(local_48.stack_,1);
      }
      goto LAB_0011b15f;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x2cc,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseStringToStream(InputStream &, OutputStream &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, SEncoding = rapidjson::UTF8<>, TEncoding = rapidjson::UTF8<>, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, OutputStream = rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::StackStream<char>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 10;
  }
  *(Ch **)(this + 0x38) = local_68.src_ + ~(ulong)local_68.head_;
LAB_0011b2e1:
  SVar4 = local_48.length_;
  if (*(int *)(this + 0x30) == 0) {
    str = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          StackStream<char>::Pop(&local_48);
    bVar5 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::String(local_38,str,SVar4 - 1,true);
    if (!bVar5) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x294,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseString(InputStream &, Handler &, bool) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0x10;
      *(long *)(this + 0x38) = (long)local_68.src_ - (long)local_68.head_;
    }
  }
  local_58->src_ = local_68.src_;
  local_58->head_ = local_68.head_;
  return;
}

Assistant:

void ParseString(InputStream& is, Handler& handler, bool isKey = false) {
        internal::StreamLocalCopy<InputStream> copy(is);
        InputStream& s(copy.s);

        bool success = false;
        if (parseFlags & kParseInsituFlag) {
            typename InputStream::Ch *head = s.PutBegin();
            ParseStringToStream<parseFlags, SourceEncoding, SourceEncoding>(s, s);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            size_t length = s.PutEnd(head) - 1;
            RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
            const typename TargetEncoding::Ch* const str = (typename TargetEncoding::Ch*)head;
            success = (isKey ? handler.Key(str, SizeType(length), false) : handler.String(str, SizeType(length), false));
        }
        else {
            StackStream<typename TargetEncoding::Ch> stackStream(stack_);
            ParseStringToStream<parseFlags, SourceEncoding, TargetEncoding>(s, stackStream);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
            SizeType length = static_cast<SizeType>(stackStream.Length()) - 1;
            const typename TargetEncoding::Ch* const str = stackStream.Pop();
            success = (isKey ? handler.Key(str, length, true) : handler.String(str, length, true));
        }
        if (!success)
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }